

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void server::listmaps(int sender)

{
  size_t sVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  char local_5d;
  int local_5c;
  vector<char_*> files;
  vector<char> line;
  
  files.buf = (char **)0x0;
  files.alen = 0;
  files.ulen = 0;
  line.buf = (char *)0x0;
  line.alen = 0;
  line.ulen = 0;
  local_5c = sender;
  listfiles(mappath,"ogz",&files);
  vector<char_*>::sort(&files);
  pcVar4 = "server map files:";
  if (files.ulen == 0) {
    pcVar4 = "server has no map files";
  }
  sendf(local_5c,1,"ris",0x23,pcVar4);
  for (iVar3 = 0; iVar3 < files.ulen; iVar3 = iVar3 + uVar5) {
    line._8_8_ = line._8_8_ & 0xffffffff;
    lVar2 = (long)iVar3;
    for (uVar5 = 0; (lVar2 < files.ulen && (uVar5 < 5)); uVar5 = uVar5 + 1) {
      if (uVar5 != 0) {
        local_5d = ' ';
        vector<char>::add(&line,&local_5d);
      }
      pcVar4 = files.buf[lVar2];
      sVar1 = strlen(pcVar4);
      vector<char>::put(&line,pcVar4,(int)sVar1);
      lVar2 = lVar2 + 1;
    }
    local_5d = '\0';
    vector<char>::add(&line,&local_5d);
    sendf(local_5c,1,"ris",0x23,line.buf);
  }
  vector<char_*>::deletearrays(&files);
  vector<char>::~vector(&line);
  vector<char_*>::~vector(&files);
  return;
}

Assistant:

void listmaps(int sender)
    {
        vector<char *> files;
        vector<char> line;
        listfiles(mappath, "ogz", files);
        files.sort();
        sendf(sender, 1, "ris", N_SERVMSG, files.length() ? "server map files:" : "server has no map files");
        for(int i = 0; i < files.length();)
        {
            line.setsize(0);
            for(int j = 0; i < files.length() && j < 5; i++, j++)
            {
                if(j) line.add(' ');
                line.put(files[i], strlen(files[i]));
            }
            line.add(0);
            sendf(sender, 1, "ris", N_SERVMSG, line.getbuf());
        }
        files.deletearrays();
    }